

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  _Base_ptr __args;
  PropertiesMap *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_iterator __position;
  cmCTest *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  mapped_type pcVar3;
  pointer pcVar4;
  _Base_ptr __n;
  _Head_base<0UL,_cmCTestRunTest_*,_false> _Var5;
  int iVar6;
  mapped_type *ppcVar7;
  ostream *poVar8;
  mapped_type_conflict1 *pmVar9;
  cmCTestRunTest *this_03;
  mapped_type *__x;
  const_iterator cVar10;
  mapped_type *pmVar11;
  _Rb_tree_header *p_Var12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
  *this_04;
  mapped_type *pmVar13;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  long *plVar16;
  size_type *psVar17;
  string *f;
  pointer pvVar18;
  ulong uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  pointer pvVar20;
  _Head_base<0UL,_cmCTestRunTest_*,_false> *runner;
  char *pcVar21;
  cmCTestTestResourceRequirement *requirement;
  pointer pcVar22;
  cmCTestMultiProcessHandler *pcVar23;
  bool bVar24;
  __single_object testRun;
  cmWorkingDirectory workdir;
  int local_274;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_270;
  PropertiesMap *local_268;
  cmCTestMultiProcessHandler *local_260;
  string local_258;
  pointer local_238;
  __uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_230;
  string local_228;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_208;
  cmCTestResourceAllocator *local_200;
  _Rb_tree_node_base *local_1f8;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  unsigned_long *puStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  int local_188;
  ios_base local_138 [264];
  
  local_274 = test;
  local_260 = this;
  if (this->HaveAffinity != 0) {
    this_01 = &this->Properties;
    ppcVar7 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_01->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_274);
    if ((*ppcVar7)->WantAffinity == true) {
      local_1a8._0_4_ = local_274;
      ppcVar7 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_01->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)local_1a8);
      pvVar20 = (pointer)(long)(*ppcVar7)->Processors;
      if ((pointer)this->ParallelLevel < (pointer)(long)(*ppcVar7)->Processors) {
        pvVar20 = (pointer)this->ParallelLevel;
      }
      if ((((pointer)this->HaveAffinity != (pointer)0x0) && ((pointer)this->HaveAffinity < pvVar20))
         && (ppcVar7 = std::
                       map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                       ::operator[](&this_01->
                                     super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                    ,(key_type *)local_1a8), (*ppcVar7)->WantAffinity != false)) {
        pvVar20 = (pointer)this->HaveAffinity;
      }
      local_238 = (pointer)(this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
      if (pvVar20 <= local_238) {
        local_1a8 = (undefined1  [8])0x0;
        puStack_1a0 = (unsigned_long *)0x0;
        local_198._M_allocated_capacity = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a8,
                   (size_type)pvVar20);
        if (pvVar20 != (pointer)0x0) {
          this_00 = &local_260->ProcessorsAvailable;
          pvVar18 = pvVar20;
          do {
            __position._M_node =
                 (local_260->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
            __args = __position._M_node + 1;
            if (puStack_1a0 == (unsigned_long *)local_198._M_allocated_capacity) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_1a8,
                         (iterator)puStack_1a0,(unsigned_long *)__args);
            }
            else {
              *puStack_1a0 = *(unsigned_long *)__args;
              puStack_1a0 = puStack_1a0 + 1;
            }
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                *)this_00,__position);
            pvVar18 = (pointer)((long)&pvVar18[-1].
                                       super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          } while (pvVar18 != (pointer)0x0);
        }
        ppcVar7 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&this_01->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,&local_274);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  (&(*ppcVar7)->Affinity,local_1a8);
        this = local_260;
        if (local_1a8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1a8,local_198._M_allocated_capacity - (long)local_1a8);
        }
        if (pvVar20 <= local_238) goto LAB_001d4a1b;
      }
      return false;
    }
  }
LAB_001d4a1b:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"test ",5);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,local_274);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  this_02 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_02,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0xa8,local_258._M_dataplus._M_p,this->Quiet);
  paVar1 = &local_258.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pmVar9 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&local_274);
  *pmVar9 = true;
  EraseTest(this,local_274);
  local_1a8._0_4_ = local_274;
  local_268 = &this->Properties;
  ppcVar7 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&local_268->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)local_1a8);
  uVar19 = (long)(*ppcVar7)->Processors;
  if (this->ParallelLevel < (ulong)(long)(*ppcVar7)->Processors) {
    uVar19 = this->ParallelLevel;
  }
  if (((this->HaveAffinity != 0) && (this->HaveAffinity < uVar19)) &&
     (ppcVar7 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&local_268->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)local_1a8), (*ppcVar7)->WantAffinity != false)) {
    uVar19 = this->HaveAffinity;
  }
  this->RunningCount = this->RunningCount + uVar19;
  this_03 = (cmCTestRunTest *)operator_new(0x288);
  cmCTestRunTest::cmCTestRunTest(this_03,this);
  if (this->RepeatMode != Never) {
    this_03->RepeatMode = this->RepeatMode;
    iVar6 = this->RepeatCount;
    this_03->NumberOfRunsLeft = iVar6;
    this_03->NumberOfRunsTotal = iVar6;
  }
  this_03->Index = local_274;
  local_270._M_head_impl = this_03;
  ppcVar7 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&local_268->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_274);
  _Var5._M_head_impl = local_270._M_head_impl;
  this_03->TestProperties = *ppcVar7;
  if (this->TestHandler->UseResourceSpec == true) {
    (local_270._M_head_impl)->UseAllocatedResources = true;
    __x = std::map<$a129e267$>::operator[](&this->AllocatedResources,&local_274);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
    ::operator=(&(_Var5._M_head_impl)->AllocatedResources,__x);
  }
  __k = (this->Failed->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->Failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pbVar2) {
    do {
      ppcVar7 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&local_268->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_274);
      pcVar3 = *ppcVar7;
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pcVar3->RequireSuccessDepends)._M_t,__k);
      if ((_Rb_tree_header *)cVar10._M_node !=
          &(pcVar3->RequireSuccessDepends)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&(local_270._M_head_impl)->FailedDependencies,__k);
      }
      __k = __k + 1;
    } while (__k != pbVar2);
  }
  pcVar23 = local_260;
  LockResources(local_260,local_274);
  pmVar11 = std::
            map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
            ::operator[](&pcVar23->ResourceAllocationErrors,&local_274);
  if ((pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ppcVar7 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&local_268->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_274);
    cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_1a8,&(*ppcVar7)->Directory);
    if (local_188 == 0) {
      runner = &local_1f0;
      local_1f0._M_head_impl = local_270._M_head_impl;
      local_270._M_head_impl = (cmCTestRunTest *)0x0;
      bVar24 = cmCTestRunTest::StartTest
                         ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)runner
                          ,pcVar23->Completed,pcVar23->Total);
    }
    else {
      local_208._M_head_impl = local_270._M_head_impl;
      local_270._M_head_impl = (cmCTestRunTest *)0x0;
      ppcVar7 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&local_268->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_274);
      std::operator+(&local_1c8,"Failed to change working directory to ",&(*ppcVar7)->Directory);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      psVar17 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_228.field_2._M_allocated_capacity = *psVar17;
        local_228.field_2._8_8_ = plVar16[3];
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      }
      else {
        local_228.field_2._M_allocated_capacity = *psVar17;
        local_228._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_228._M_string_length = plVar16[1];
      *plVar16 = (long)psVar17;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      strerror(local_188);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_228);
      psVar17 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_258.field_2._M_allocated_capacity = *psVar17;
        local_258.field_2._8_4_ = (undefined4)plVar16[3];
        local_258.field_2._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
        local_258._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar17;
        local_258._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_258._M_string_length = plVar16[1];
      *plVar16 = (long)psVar17;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"Failed to change working directory","");
      runner = &local_208;
      cmCTestRunTest::StartFailure
                ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)runner,
                 &local_258,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar1) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      bVar24 = false;
    }
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)runner);
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_1a8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Insufficient resources for test ",0x20);
    ppcVar7 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&local_268->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_274);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,((*ppcVar7)->Name)._M_dataplus._M_p,
                        ((*ppcVar7)->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n\n",3);
    pmVar11 = std::
              map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
              ::operator[](&pcVar23->ResourceAllocationErrors,&local_274);
    p_Var15 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var15 != p_Var12) {
      local_200 = &pcVar23->ResourceAllocator;
      local_1f8 = &p_Var12->_M_header;
      do {
        if (p_Var15[2]._M_color == _S_black) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  Test requested resources of type \'",0x24);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)(p_Var15 + 1),
                              (long)p_Var15[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\' in the following amounts:\n",0x1c);
          ppcVar7 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&local_268->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,&local_274);
          pvVar20 = ((*ppcVar7)->ResourceGroups).
                    super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_238 = ((*ppcVar7)->ResourceGroups).
                      super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (pvVar20 != local_238) {
            do {
              pcVar4 = (pvVar20->
                       super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pcVar22 = (pvVar20->
                             super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                             )._M_impl.super__Vector_impl_data._M_start; pcVar22 != pcVar4;
                  pcVar22 = pcVar22 + 1) {
                __n = (_Base_ptr)(pcVar22->ResourceType)._M_string_length;
                if ((__n == p_Var15[1]._M_parent) &&
                   ((__n == (_Base_ptr)0x0 ||
                    (iVar6 = bcmp((pcVar22->ResourceType)._M_dataplus._M_p,*(void **)(p_Var15 + 1),
                                  (size_t)__n), iVar6 == 0)))) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
                  poVar8 = (ostream *)
                           std::ostream::operator<<((ostream *)local_1a8,pcVar22->SlotsNeeded);
                  bVar24 = pcVar22->SlotsNeeded == 1;
                  pcVar21 = " slots\n";
                  if (bVar24) {
                    pcVar21 = " slot\n";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,pcVar21,(ulong)bVar24 ^ 7);
                }
              }
              pvVar20 = pvVar20 + 1;
            } while (pvVar20 != local_238);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  but only the following units were available:\n",0x2f);
          pcVar23 = local_260;
          this_04 = cmCTestResourceAllocator::GetResources_abi_cxx11_(local_200);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
                    ::at(this_04,(key_type *)(p_Var15 + 1));
          for (p_Var14 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    \'",5);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,*(char **)(p_Var14 + 1),
                                (long)p_Var14[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\': ",3);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            bVar24 = p_Var14[2]._M_color == _S_black;
            pcVar21 = " slots\n";
            if (bVar24) {
              pcVar21 = " slot\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar21,(ulong)bVar24 ^ 7);
          }
        }
        else if (p_Var15[2]._M_color == _S_red) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  Test requested resources of type \'",0x24);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)(p_Var15 + 1),
                              (long)p_Var15[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\' which does not exist\n",0x17);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      } while (p_Var15 != local_1f8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Resource spec file:\n\n  ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(pcVar23->TestHandler->ResourceSpecFile)._M_dataplus._M_p,
               (pcVar23->TestHandler->ResourceSpecFile)._M_string_length);
    local_230._M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
    super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
         (tuple<cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>)
         (tuple<cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>)local_270._M_head_impl;
    local_270._M_head_impl = (cmCTestRunTest *)0x0;
    std::__cxx11::stringbuf::str();
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"Insufficient resources","");
    cmCTestRunTest::StartFailure
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_230,
               &local_258,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_230);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar24 = false;
  }
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
            ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_270);
  return bVar24;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  if (this->HaveAffinity && this->Properties[test]->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(test);
    if (needProcessors > this->ProcessorsAvailable.size()) {
      return false;
    }
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    this->Properties[test]->Affinity = std::move(affinity);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += this->GetProcessorsUsed(test);

  auto testRun = cm::make_unique<cmCTestRunTest>(*this);

  if (this->RepeatMode != cmCTest::Repeat::Never) {
    testRun->SetRepeatMode(this->RepeatMode);
    testRun->SetNumberOfRuns(this->RepeatCount);
  }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);
  if (this->TestHandler->UseResourceSpec) {
    testRun->SetUseAllocatedResources(true);
    testRun->SetAllocatedResources(this->AllocatedResources[test]);
  }

  // Find any failed dependencies for this test. We assume the more common
  // scenario has no failed tests, so make it the outer loop.
  for (std::string const& f : *this->Failed) {
    if (cm::contains(this->Properties[test]->RequireSuccessDepends, f)) {
      testRun->AddFailedDependency(f);
    }
  }

  // Always lock the resources we'll be using, even if we fail to set the
  // working directory because FinishTestProcess() will try to unlock them
  this->LockResources(test);

  if (!this->ResourceAllocationErrors[test].empty()) {
    std::ostringstream e;
    e << "Insufficient resources for test " << this->Properties[test]->Name
      << ":\n\n";
    for (auto const& it : this->ResourceAllocationErrors[test]) {
      switch (it.second) {
        case ResourceAllocationError::NoResourceType:
          e << "  Test requested resources of type '" << it.first
            << "' which does not exist\n";
          break;

        case ResourceAllocationError::InsufficientResources:
          e << "  Test requested resources of type '" << it.first
            << "' in the following amounts:\n";
          for (auto const& group : this->Properties[test]->ResourceGroups) {
            for (auto const& requirement : group) {
              if (requirement.ResourceType == it.first) {
                e << "    " << requirement.SlotsNeeded
                  << (requirement.SlotsNeeded == 1 ? " slot\n" : " slots\n");
              }
            }
          }
          e << "  but only the following units were available:\n";
          for (auto const& res :
               this->ResourceAllocator.GetResources().at(it.first)) {
            e << "    '" << res.first << "': " << res.second.Total
              << (res.second.Total == 1 ? " slot\n" : " slots\n");
          }
          break;
      }
      e << "\n";
    }
    e << "Resource spec file:\n\n  " << this->TestHandler->ResourceSpecFile;
    cmCTestRunTest::StartFailure(std::move(testRun), e.str(),
                                 "Insufficient resources");
    return false;
  }

  cmWorkingDirectory workdir(this->Properties[test]->Directory);
  if (workdir.Failed()) {
    cmCTestRunTest::StartFailure(std::move(testRun),
                                 "Failed to change working directory to " +
                                   this->Properties[test]->Directory + " : " +
                                   std::strerror(workdir.GetLastResult()),
                                 "Failed to change working directory");
    return false;
  }

  // Ownership of 'testRun' has moved to another structure.
  // When the test finishes, FinishTestProcess will be called.
  return cmCTestRunTest::StartTest(std::move(testRun), this->Completed,
                                   this->Total);
}